

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::adaptive_huffman_data_model::clear(adaptive_huffman_data_model *this)

{
  vector<unsigned_short> *in_RDI;
  
  vector<unsigned_short>::clear(in_RDI);
  vector<unsigned_short>::clear(in_RDI);
  vector<unsigned_char>::clear((vector<unsigned_char> *)in_RDI);
  *(undefined4 *)&in_RDI->m_p = 0;
  *(undefined4 *)((long)&in_RDI->m_p + 4) = 0;
  in_RDI->m_size = 0;
  *(undefined1 *)&in_RDI[4].m_size = 0;
  in_RDI->m_capacity = 0;
  if (in_RDI[4].m_p != (unsigned_short *)0x0) {
    crnlib_delete<crnlib::prefix_coding::decoder_tables>((decoder_tables *)0x2307c1);
    in_RDI[4].m_p = (unsigned_short *)0x0;
  }
  return;
}

Assistant:

void adaptive_huffman_data_model::clear() {
  m_sym_freq.clear();
  m_codes.clear();
  m_code_sizes.clear();

  m_total_syms = 0;
  m_update_cycle = 0;
  m_symbols_until_update = 0;
  m_decoder_table_bits = 0;
  m_total_count = 0;

  if (m_pDecode_tables) {
    crnlib_delete(m_pDecode_tables);
    m_pDecode_tables = NULL;
  }
}